

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O2

EvictionResult * __thiscall
duckdb::BufferPool::EvictBlocksInternal
          (EvictionResult *__return_storage_ptr__,BufferPool *this,EvictionQueue *queue,
          MemoryTag tag,idx_t extra_memory,idx_t memory_limit,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *buffer)

{
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> _Var1;
  bool bVar2;
  bool bVar3;
  idx_t iVar4;
  BlockHandle *pBVar5;
  type handle_p;
  pointer pFVar6;
  shared_ptr<duckdb::BlockHandle,_true> handle;
  BufferEvictionNode node;
  BufferPoolReservation local_60;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_48;
  
  TempBufferPoolReservation::TempBufferPoolReservation
            ((TempBufferPoolReservation *)&local_60,tag,this,extra_memory);
  iVar4 = MemoryUsage::GetUsedMemory(&this->memory_usage,NO_FLUSH);
  if (iVar4 <= memory_limit) {
    bVar2 = Allocator::SupportsFlush();
    if ((bVar2) &&
       ((this->allocator_bulk_deallocation_flush_threshold).super___atomic_base<unsigned_long>._M_i
        < extra_memory)) {
      Allocator::FlushAll();
    }
    __return_storage_ptr__->success = true;
LAB_014b88c5:
    (__return_storage_ptr__->reservation).super_BufferPoolReservation.tag = local_60.tag;
    (__return_storage_ptr__->reservation).super_BufferPoolReservation.pool = local_60.pool;
    (__return_storage_ptr__->reservation).super_BufferPoolReservation.size = local_60.size;
    local_60.size = 0;
    TempBufferPoolReservation::~TempBufferPoolReservation((TempBufferPoolReservation *)&local_60);
    return __return_storage_ptr__;
  }
LAB_014b8714:
  node.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  node.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar2 = duckdb_moodycamel::
          ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
          ::try_dequeue<duckdb::BufferEvictionNode>(&queue->q,&node);
  if ((!bVar2) && (bVar2 = EvictionQueue::TryDequeueWithLock(queue,&node), !bVar2)) {
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&node.handle.internal.
                super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar2 = false;
    BufferPoolReservation::Resize(&local_60,0);
    goto LAB_014b88bb;
  }
  BufferEvictionNode::TryGetBlockHandle((BufferEvictionNode *)&handle);
  if (handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    LOCK();
    (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
         (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
  }
  else {
    pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&handle);
    ::std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&stack0xffffffffffffffc0,&pBVar5->lock);
    handle_p = shared_ptr<duckdb::BlockHandle,_true>::operator*(&handle);
    bVar2 = BufferEvictionNode::CanUnload(&node,handle_p);
    if (bVar2) {
      if (buffer != (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *
                    )0x0) {
        pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&handle);
        pFVar6 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
                 operator->(&pBVar5->buffer);
        if (pFVar6->internal_size == extra_memory) {
          pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&handle);
          BlockHandle::UnloadAndTakeBlock
                    ((BlockHandle *)&stack0xffffffffffffffb8,(BlockLock *)pBVar5);
          _Var1._M_head_impl =
               (buffer->
               super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
               super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>
               .super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
          (buffer->super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>).
          _M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
          super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = local_48._M_head_impl;
          if (_Var1._M_head_impl != (FileBuffer *)0x0) {
            (**(code **)((long)(_Var1._M_head_impl)->_vptr_FileBuffer + 8))();
          }
LAB_014b887e:
          ::std::unique_lock<std::mutex>::~unique_lock
                    ((unique_lock<std::mutex> *)&stack0xffffffffffffffc0);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&handle.internal.
                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                    (&node.handle.internal.
                      super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
          ;
          bVar3 = Allocator::SupportsFlush();
          bVar2 = true;
          if ((bVar3) &&
             ((this->allocator_bulk_deallocation_flush_threshold).super___atomic_base<unsigned_long>
              ._M_i < extra_memory)) {
            Allocator::FlushAll();
          }
LAB_014b88bb:
          __return_storage_ptr__->success = bVar2;
          goto LAB_014b88c5;
        }
      }
      pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&handle);
      BlockHandle::Unload(pBVar5,(BlockLock *)handle_p);
      iVar4 = MemoryUsage::GetUsedMemory(&this->memory_usage,NO_FLUSH);
      if (iVar4 <= memory_limit) goto LAB_014b887e;
    }
    else {
      LOCK();
      (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
           (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
    }
    ::std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)&stack0xffffffffffffffc0);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&node.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  goto LAB_014b8714;
}

Assistant:

BufferPool::EvictionResult BufferPool::EvictBlocksInternal(EvictionQueue &queue, MemoryTag tag, idx_t extra_memory,
                                                           idx_t memory_limit, unique_ptr<FileBuffer> *buffer) {
	TempBufferPoolReservation r(tag, *this, extra_memory);
	bool found = false;

	if (memory_usage.GetUsedMemory(MemoryUsageCaches::NO_FLUSH) <= memory_limit) {
		if (Allocator::SupportsFlush() && extra_memory > allocator_bulk_deallocation_flush_threshold) {
			Allocator::FlushAll();
		}
		return {true, std::move(r)};
	}

	queue.IterateUnloadableBlocks([&](BufferEvictionNode &, const shared_ptr<BlockHandle> &handle, BlockLock &lock) {
		// hooray, we can unload the block
		if (buffer && handle->GetBuffer(lock)->AllocSize() == extra_memory) {
			// we can re-use the memory directly
			*buffer = handle->UnloadAndTakeBlock(lock);
			found = true;
			return false;
		}

		// release the memory and mark the block as unloaded
		handle->Unload(lock);

		if (memory_usage.GetUsedMemory(MemoryUsageCaches::NO_FLUSH) <= memory_limit) {
			found = true;
			return false;
		}

		// Continue iteration
		return true;
	});

	if (!found) {
		r.Resize(0);
	} else if (Allocator::SupportsFlush() && extra_memory > allocator_bulk_deallocation_flush_threshold) {
		Allocator::FlushAll();
	}

	return {found, std::move(r)};
}